

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ootake_PSG.c
# Opt level: O2

UINT8 device_start_c6280_ootake(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint uVar1;
  DEV_DATA chip;
  uint uVar2;
  UINT8 UVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  huc6280_state *info;
  long lVar7;
  double dVar8;
  
  uVar2 = cfg->clock;
  uVar5 = uVar2 >> 4;
  if (cfg->srMode == '\x02') {
    if (uVar5 <= cfg->smplRate) {
      uVar5 = cfg->smplRate;
    }
  }
  else if (cfg->srMode == '\x01') {
    uVar5 = cfg->smplRate;
  }
  if (_bTblInit == '\0') {
    _VolumeTable[0] = 0;
    iVar6 = 0x5a;
    for (lVar7 = 1; lVar7 != 0x5c; lVar7 = lVar7 + 1) {
      dVar8 = pow(10.0,((double)iVar6 * -1.08689999991) / 20.0);
      _VolumeTable[lVar7] = (int)(dVar8 * 32768.0);
      iVar6 = iVar6 + -1;
    }
    uVar1 = 0x100;
    for (lVar7 = 0; lVar7 != 0x20000; lVar7 = lVar7 + 4) {
      uVar4 = uVar1 & 1;
      uVar1 = ((uVar1 ^ uVar1 >> 1) & 1) << 0xe | uVar1 >> 1;
      *(uint *)((long)_NoiseTable + lVar7) = -(uint)(uVar4 == 0) | 0xffffffee;
    }
    _bTblInit = '\x01';
  }
  chip.chipInf = calloc(1,0x678);
  if ((DEV_DATA *)chip.chipInf == (DEV_DATA *)0x0) {
    UVar3 = 0xff;
  }
  else {
    ((DEV_DATA *)((long)chip.chipInf + 0x10))->chipInf = (void *)(double)uVar2;
    ((DEV_DATA *)((long)chip.chipInf + 0x640))->chipInf = (void *)0x3f80cd578fb0f835;
    *(undefined8 *)((long)chip.chipInf + 0x648) = 0x3f80000000000000;
    for (uVar2 = 0; *(uint *)&((DEV_DATA *)((long)chip.chipInf + 0x620))->chipInf = uVar2, uVar2 < 6
        ; uVar2 = uVar2 + 1) {
      for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 1) {
        *(undefined4 *)((long)chip.chipInf + lVar7 * 4 + (ulong)uVar2 * 0xb8 + 0x3c) = 0x11;
        uVar2 = *(uint *)&((DEV_DATA *)((long)chip.chipInf + 0x620))->chipInf;
      }
    }
    *(undefined4 *)&((DEV_DATA *)((long)chip.chipInf + 0x620))->chipInf = 0;
    UVar3 = '\0';
    OPSG_SetMuteMask(chip.chipInf,0);
    ((DEV_DATA *)((long)chip.chipInf + 8))->chipInf = (void *)(double)uVar5;
    ((DEV_DATA *)((long)chip.chipInf + 0x18))->chipInf =
         (void *)((double)((DEV_DATA *)((long)chip.chipInf + 0x10))->chipInf / (double)uVar5);
    *(UINT8 *)&((DEV_DATA *)((long)chip.chipInf + 0x670))->chipInf = cfg->flags;
    *(void **)chip.chipInf = chip.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)chip.chipInf;
    retDevInf->sampleRate = uVar5;
    retDevInf->devDef = &devDef_C6280_Ootake;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  }
  return UVar3;
}

Assistant:

static UINT8 device_start_c6280_ootake(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	void* chip;
	DEV_DATA* devData;
	UINT32 rate;
	
	rate = cfg->clock / 16;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);
	
	chip = OPSG_Init(cfg->clock, rate);
	if (chip == NULL)
		return 0xFF;
	
	OPSG_SetHoneyInTheSky(chip, cfg->flags);
	
	devData = (DEV_DATA*)chip;
	devData->chipInf = chip;
	INIT_DEVINF(retDevInf, devData, rate, &devDef_C6280_Ootake);
	return 0x00;
}